

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O0

fdtd1D * init_fdtd_1D(float_type domain_size,float_type Sc,float_type smallest_wavelength,
                     border_condition *borders)

{
  undefined1 auVar1 [16];
  size_t __nmemb;
  float_type *pfVar2;
  border_condition *in_RSI;
  fdtd1D *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double in_XMM1_Qa;
  undefined1 auVar6 [16];
  double in_XMM2_Qa;
  uintmax_t sizeX;
  float_type sizeXf;
  float_type dt;
  float_type dx;
  
  dVar3 = in_XMM2_Qa / 20.0;
  dVar4 = (dVar3 * in_XMM1_Qa) / 299792458.0;
  auVar5._0_8_ = in_XMM0_Qa / dVar3;
  auVar5._8_8_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar5._0_8_;
  auVar5 = vroundsd_avx(auVar5,auVar6,10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = auVar5._0_8_;
  __nmemb = vcvttsd2usi_avx512f(auVar1);
  in_RDI->dx = dVar3;
  in_RDI->dt = dVar4;
  pfVar2 = (float_type *)calloc(__nmemb,8);
  in_RDI->ez = pfVar2;
  pfVar2 = (float_type *)calloc(__nmemb,8);
  in_RDI->hy = pfVar2;
  pfVar2 = (float_type *)calloc(__nmemb,8);
  in_RDI->permittivity_inv = pfVar2;
  pfVar2 = (float_type *)calloc(__nmemb,8);
  in_RDI->permeability_inv = pfVar2;
  in_RDI->border_condition[0] = *in_RSI;
  in_RDI->border_condition[1] = in_RSI[1];
  in_RDI->domain_size = in_XMM0_Qa;
  in_RDI->sizeX = __nmemb;
  in_RDI->Sc = in_XMM1_Qa;
  in_RDI->num_Jsources = 0;
  in_RDI->Jsources = (fdtd_source *)0x0;
  in_RDI->JsourceLocations = (uintmax_t *)0x0;
  in_RDI->num_Msources = 0;
  in_RDI->Msources = (fdtd_source *)0x0;
  in_RDI->MsourceLocations = (uintmax_t *)0x0;
  in_RDI->time = 0.0;
  fprintf(_stderr,"Dt %e Dx %e (%.0f)\n",dVar4,dVar3,auVar5._0_8_);
  return in_RDI;
}

Assistant:

struct fdtd1D init_fdtd_1D(float_type domain_size, float_type Sc,
                           float_type smallest_wavelength,
                           enum border_condition borders[num_borders_1D]) {

  float_type dx = smallest_wavelength / float_cst(20.);
  float_type dt = dx * Sc / c_light;
  float_type sizeXf = ceil(domain_size / dx);
  uintmax_t sizeX = (uintmax_t)sizeXf;
  struct fdtd1D fdtd = {
      .dx = dx,
      .dt = dt,
      .ez = calloc(sizeX, sizeof(float_type)),
      .hy = calloc(sizeX, sizeof(float_type)),
      .permittivity_inv = calloc(sizeX, sizeof(float_type)),
      .permeability_inv = calloc(sizeX, sizeof(float_type)),
      .border_condition = {[border_oneside] = borders[border_oneside],
                           [border_otherside] = borders[border_otherside]},
      .domain_size = domain_size,
      .sizeX = sizeX,
      .Sc = Sc,
      .num_Jsources = 0,
      .Jsources = NULL,
      .JsourceLocations = NULL,
      .num_Msources = 0,
      .Msources = NULL,
      .MsourceLocations = NULL,
      .time = 0,
  };
  fprintf(stderr, "Dt %e Dx %e (%.0f)\n", dt, dx, sizeXf);

  return fdtd;
}